

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityStateUpdatePdu.cpp
# Opt level: O0

void __thiscall
DIS::EntityStateUpdatePdu::unmarshal(EntityStateUpdatePdu *this,DataStream *dataStream)

{
  undefined1 local_40 [8];
  VariableParameter x;
  size_t idx;
  DataStream *dataStream_local;
  EntityStateUpdatePdu *this_local;
  
  EntityInformationFamilyPdu::unmarshal(&this->super_EntityInformationFamilyPdu,dataStream);
  EntityID::unmarshal(&this->_entityID,dataStream);
  DataStream::operator>>(dataStream,&this->_padding1);
  DataStream::operator>>(dataStream,&this->_numberOfVariableParameters);
  Vector3Float::unmarshal(&this->_entityLinearVelocity,dataStream);
  Vector3Double::unmarshal(&this->_entityLocation,dataStream);
  EulerAngles::unmarshal(&this->_entityOrientation,dataStream);
  DataStream::operator>>(dataStream,&this->_entityAppearance);
  std::vector<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>::clear
            (&this->_variableParameters);
  x._variableParameterFields2 = 0;
  x._variableParameterFields3 = 0;
  x._variableParameterFields4 = '\0';
  x._31_1_ = 0;
  for (; (ulong)x._24_8_ < (ulong)this->_numberOfVariableParameters; x._24_8_ = x._24_8_ + 1) {
    VariableParameter::VariableParameter((VariableParameter *)local_40);
    VariableParameter::unmarshal((VariableParameter *)local_40,dataStream);
    std::vector<DIS::VariableParameter,_std::allocator<DIS::VariableParameter>_>::push_back
              (&this->_variableParameters,(value_type *)local_40);
    VariableParameter::~VariableParameter((VariableParameter *)local_40);
  }
  return;
}

Assistant:

void EntityStateUpdatePdu::unmarshal(DataStream& dataStream)
{
    EntityInformationFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _entityID.unmarshal(dataStream);
    dataStream >> _padding1;
    dataStream >> _numberOfVariableParameters;
    _entityLinearVelocity.unmarshal(dataStream);
    _entityLocation.unmarshal(dataStream);
    _entityOrientation.unmarshal(dataStream);
    dataStream >> _entityAppearance;

     _variableParameters.clear();
     for(size_t idx = 0; idx < _numberOfVariableParameters; idx++)
     {
        VariableParameter x;
        x.unmarshal(dataStream);
        _variableParameters.push_back(x);
     }
}